

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  long lVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  byte *pbVar11;
  uint uVar10;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar4 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar11 = (byte *)(ptr + 1);
    ppcVar5 = (char **)(end + -(long)pbVar11);
    if ((long)ppcVar5 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar11)) {
    case 5:
      if (ppcVar5 == (char **)0x1) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[0])
                        (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,ppcVar5
                        );
      lVar6 = 3;
      break;
    case 6:
      if ((long)ppcVar5 < 3) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[1])
                        (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,ppcVar5
                        );
      lVar6 = 4;
      break;
    case 7:
      if ((long)ppcVar5 < 4) {
        return -2;
      }
      iVar3 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,
                         (char *)ppcVar5);
      lVar6 = 5;
      break;
    default:
      goto switchD_00407abf_caseD_8;
    case 0xf:
      iVar3 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar3;
    case 0x10:
      pbVar8 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar8;
          return 0;
        }
        iVar3 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar3;
      }
      pcVar4 = ptr + 3;
      if ((long)end - (long)pcVar4 < 6) {
        return -1;
      }
      lVar6 = 0;
      while (pcVar4[lVar6] == (&big2_scanCdataSection_CDATA_LSQB)[lVar6]) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 6) {
          *nextTokPtr = ptr + 9;
          return 8;
        }
      }
      pbVar8 = (byte *)(pcVar4 + lVar6);
      goto LAB_00407fde;
    case 0x11:
      pbVar11 = (byte *)(ptr + 2);
      ppcVar5 = (char **)(end + -(long)pbVar11);
      if ((long)ppcVar5 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
      if (bVar1 < 0x16) {
        if (bVar1 == 5) {
          if (ppcVar5 == (char **)0x1) {
            return -2;
          }
          iVar3 = (*enc[3].literalScanners[0])
                            (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,
                             ppcVar5);
          lVar6 = 4;
        }
        else if (bVar1 == 6) {
          if ((long)ppcVar5 < 3) {
            return -2;
          }
          iVar3 = (*enc[3].literalScanners[1])
                            (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,
                             ppcVar5);
          lVar6 = 5;
        }
        else {
          if (bVar1 != 7) goto switchD_00407abf_caseD_8;
          if ((long)ppcVar5 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)pbVar11,(char *)&switchD_00407abf::switchdataD_0057b034,
                             (char *)ppcVar5);
          lVar6 = 6;
        }
        if (iVar3 == 0) goto switchD_00407abf_caseD_8;
      }
      else {
        lVar6 = 3;
        if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_00407abf_caseD_8;
      }
      ptr = ptr + lVar6;
      while( true ) {
        lVar6 = (long)end - (long)ptr;
        if (lVar6 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar10 - 5;
        if (0x18 < uVar9) break;
        lVar7 = 1;
        pcVar4 = (char *)((long)&switchD_00407f55::switchdataD_0057b084 +
                         (long)(int)(&switchD_00407f55::switchdataD_0057b084)[uVar9]);
        switch(uVar10) {
        case 5:
          if (lVar6 == 1) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[0])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 2;
          break;
        case 6:
          if (lVar6 < 3) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[1])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 3;
          break;
        case 7:
          if (lVar6 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 4;
          break;
        default:
          goto switchD_00407941_caseD_0;
        case 9:
        case 10:
        case 0x15:
          ptr = (char *)((byte *)ptr + 1);
          lVar6 = (long)end - (long)ptr;
          while( true ) {
            if (lVar6 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
            ptr = (char *)((byte *)ptr + 1);
            lVar6 = lVar6 + -1;
          }
          if (bVar1 != 0xb) goto switchD_00407941_caseD_0;
        case 0xb:
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 5;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_00407f55_caseD_16;
        }
        if (iVar3 == 0) break;
switchD_00407f55_caseD_16:
        ptr = (char *)((byte *)ptr + lVar7);
      }
      goto switchD_00407941_caseD_0;
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_00407c36;
    }
    if (iVar3 != 0) {
LAB_00407c36:
      ptr = ptr + lVar6;
      do {
        lVar6 = (long)end - (long)ptr;
        if (lVar6 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar10 - 5;
        if (0x18 < uVar9) goto switchD_00407941_caseD_0;
        lVar7 = 1;
        pcVar4 = (char *)((long)&switchD_00407c76::switchdataD_0057b0e8 +
                         (long)(int)(&switchD_00407c76::switchdataD_0057b0e8)[uVar9]);
        switch(uVar10) {
        case 5:
          if (lVar6 == 1) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[0])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 2;
          break;
        case 6:
          if (lVar6 < 3) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[1])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 3;
          break;
        case 7:
          if (lVar6 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar4,(char **)0x1);
          lVar7 = 4;
          break;
        default:
          goto switchD_00407941_caseD_0;
        case 9:
        case 10:
        case 0x15:
          ptr = (char *)((byte *)ptr + 1);
          ppcVar5 = (char **)(end + -(long)ptr);
          if ((long)ppcVar5 < 1) {
            return -1;
          }
          goto LAB_00407e06;
        case 0xb:
          goto switchD_00407c76_caseD_b;
        case 0x11:
          goto switchD_00407c76_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_00407c76_caseD_16;
        }
        if (iVar3 == 0) goto switchD_00407941_caseD_0;
switchD_00407c76_caseD_16:
        ptr = (char *)((byte *)ptr + lVar7);
      } while( true );
    }
    goto switchD_00407abf_caseD_8;
  case 3:
    iVar3 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 4:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -5;
    }
    if (*pbVar8 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x00407ada;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (*enc[3].nameLength)(enc,ptr);
    if (iVar3 == 0) {
      pcVar4 = extraout_RDX_00;
      pbVar8 = (byte *)(ptr + 2);
      goto joined_r0x00407ada;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar4 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar4 == 0) {
      pcVar4 = extraout_RDX;
      pbVar8 = (byte *)(ptr + 3);
      goto joined_r0x00407ada;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar3 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)(end + -(long)ptr));
    if (iVar3 == 0) {
      pcVar4 = extraout_RDX_01;
      pbVar8 = (byte *)(ptr + 4);
      goto joined_r0x00407ada;
    }
    break;
  case 9:
    pcVar4 = ptr + 1;
    if (end != pcVar4 && -1 < (long)end - (long)pcVar4) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar4 = ptr + 2;
      }
      *nextTokPtr = pcVar4;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar8 = (byte *)(ptr + 1);
joined_r0x00407ada:
    while( true ) {
      pbVar11 = pbVar8;
      lVar6 = (long)end - (long)pbVar11;
      if (lVar6 < 1) {
        *nextTokPtr = (char *)pbVar11;
        return 6;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
      if ((ulong)bVar1 < 0xb) break;
      pbVar8 = pbVar11 + 1;
    }
    switch(bVar1) {
    case 4:
      if (lVar6 == 1) break;
      pbVar8 = pbVar11 + 1;
      if (pbVar11[1] != 0x5d) goto joined_r0x00407ada;
      if (lVar6 < 3) break;
      if (pbVar11[2] == 0x3e) goto LAB_00407dc5;
      goto joined_r0x00407ada;
    case 5:
      if ((lVar6 != 1) && (iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar11), iVar3 == 0)) {
        pcVar4 = extraout_RDX_03;
        pbVar8 = pbVar11 + 2;
        goto joined_r0x00407ada;
      }
      break;
    case 6:
      if ((2 < lVar6) && (pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar11), (int)pcVar4 == 0)) {
        pcVar4 = extraout_RDX_02;
        pbVar8 = pbVar11 + 3;
        goto joined_r0x00407ada;
      }
      break;
    case 7:
      if ((3 < lVar6) &&
         (iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar11,(int)pcVar4,
                                    (ATTRIBUTE *)
                                    ((long)&switchD_00407b06::switchdataD_0057b1b0 +
                                    (long)(int)(&switchD_00407b06::switchdataD_0057b1b0)[bVar1])),
         iVar3 == 0)) {
        pcVar4 = extraout_RDX_04;
        pbVar8 = pbVar11 + 4;
        goto joined_r0x00407ada;
      }
    }
    *nextTokPtr = (char *)pbVar11;
    return 6;
  }
switchD_00407941_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_00407e06:
  uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar9 = uVar10 - 5;
  if (uVar9 < 0x19) {
    pcVar4 = (char *)((long)&switchD_00407e27::switchdataD_0057b14c +
                     (long)(int)(&switchD_00407e27::switchdataD_0057b14c)[uVar9]);
    switch(uVar10) {
    case 5:
      if (ppcVar5 == (char **)0x1) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar4,ppcVar5);
      lVar6 = 3;
      break;
    case 6:
      if (ppcVar5 < (char **)0x3) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar4,ppcVar5);
      lVar6 = 4;
      break;
    case 7:
      if (ppcVar5 < &DAT_00000004) {
        return -2;
      }
      iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar4,(char *)ppcVar5);
      lVar6 = 5;
      break;
    default:
      goto switchD_00407941_caseD_0;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00407e27_caseD_9;
    case 0xb:
      goto switchD_00407c76_caseD_b;
    case 0x11:
      goto switchD_00407c76_caseD_11;
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_0040808d;
    }
    if (iVar3 != 0) {
LAB_0040808d:
      iVar3 = normal_scanAtts(enc,(char *)((byte *)ptr + lVar6 + -1),end,nextTokPtr);
      return iVar3;
    }
  }
  goto switchD_00407941_caseD_0;
switchD_00407e27_caseD_9:
  ptr = (char *)((byte *)ptr + 1);
  ppcVar5 = (char **)((long)ppcVar5 + -1);
  if ((long)ppcVar5 < 1) {
    return -1;
  }
  goto LAB_00407e06;
switchD_00407c76_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 1);
  return 2;
switchD_00407c76_caseD_11:
  pbVar8 = (byte *)ptr + 1;
  if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
    return -1;
  }
  if (*pbVar8 == 0x3e) {
    *nextTokPtr = (char *)((byte *)ptr + 2);
    return 4;
  }
LAB_00407fde:
  *nextTokPtr = (char *)pbVar8;
  return 0;
LAB_00407dc5:
  pbVar11 = pbVar11 + 2;
switchD_00407abf_caseD_8:
  *nextTokPtr = (char *)pbVar11;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}